

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int __thiscall
libtorrent::aux::
bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,string_type *str)

{
  size_type sVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  string *__range2;
  
  iVar3 = write_integer<std::back_insert_iterator<std::__cxx11::string>,unsigned_long,void>
                    (this->out,str->_M_string_length);
  ::std::__cxx11::string::push_back((char)this->out->container);
  sVar1 = str->_M_string_length;
  if (sVar1 == 0) {
    iVar4 = 0;
  }
  else {
    pbVar2 = this->out;
    sVar5 = 0;
    do {
      ::std::__cxx11::string::push_back((char)pbVar2->container);
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
    iVar4 = (int)str->_M_string_length;
  }
  return iVar4 + iVar3 + 1;
}

Assistant:

int operator()(entry::string_type const& str)
		{
			int ret = write_integer(out, str.length());
			write_char(out, ':');
			ret += write_string(str, out);
			return ret + 1;
		}